

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O1

int __thiscall fmt::File::dup(File *this,int __fd)

{
  int iVar1;
  SystemError *this_00;
  int *piVar2;
  int local_14;
  
  iVar1 = ::dup(__fd);
  if (iVar1 != -1) {
    this->fd_ = iVar1;
    return (int)this;
  }
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  SystemError::SystemError<int>(this_00,*piVar2,(CStringRef)0x396650,&local_14);
  __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

fmt::File fmt::File::dup(int fd) {
  // Don't retry as dup doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009695399/functions/dup.html
  int new_fd = FMT_POSIX_CALL(dup(fd));
  if (new_fd == -1)
    FMT_THROW(SystemError(errno, "cannot duplicate file descriptor {}", fd));
  return File(new_fd);
}